

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_update_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_139;
  uchar local_138 [7];
  uchar c;
  uchar buf [256];
  size_t n;
  FILE *f;
  int ret;
  char *path_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  n = (size_t)fopen(path,"rb");
  if ((FILE *)n != (FILE *)0x0) {
    buf._248_8_ = fread(local_138,1,0x100,(FILE *)n);
    sVar2 = fread(&local_139,1,1,(FILE *)n);
    if (sVar2 == 0) {
      if ((buf._248_8_ == 0) || (iVar1 = ferror((FILE *)n), iVar1 != 0)) {
        f._4_4_ = -7;
      }
      else {
        fclose((FILE *)n);
        n = 0;
        f._4_4_ = mbedtls_hmac_drbg_update_ret(ctx,local_138,buf._248_8_);
      }
    }
    else {
      f._4_4_ = -5;
    }
    mbedtls_platform_zeroize(local_138,0x100);
    if (n != 0) {
      fclose((FILE *)n);
    }
    if (f._4_4_ == 0) {
      ctx_local._4_4_ = mbedtls_hmac_drbg_write_seed_file(ctx,path);
    }
    else {
      ctx_local._4_4_ = f._4_4_;
    }
    return ctx_local._4_4_;
  }
  return -7;
}

Assistant:

int mbedtls_hmac_drbg_update_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    int ret = 0;
    FILE *f = NULL;
    size_t n;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];
    unsigned char c;

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    n = fread( buf, 1, sizeof( buf ), f );
    if( fread( &c, 1, 1, f ) != 0 )
    {
        ret = MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG;
        goto exit;
    }
    if( n == 0 || ferror( f ) )
    {
        ret = MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR;
        goto exit;
    }
    fclose( f );
    f = NULL;

    ret = mbedtls_hmac_drbg_update_ret( ctx, buf, n );

exit:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );
    if( f != NULL )
        fclose( f );
    if( ret != 0 )
        return( ret );
    return( mbedtls_hmac_drbg_write_seed_file( ctx, path ) );
}